

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_init_find_case(bson_iter_t *iter,bson_t *bson,char *key)

{
  _Bool _Var1;
  _Bool local_21;
  char *key_local;
  bson_t *bson_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0xe7,"bson_iter_init_find_case","iter");
    abort();
  }
  if (bson != (bson_t *)0x0) {
    if (key != (char *)0x0) {
      _Var1 = bson_iter_init(iter,bson);
      local_21 = false;
      if (_Var1) {
        local_21 = bson_iter_find_case(iter,key);
      }
      return local_21;
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0xe9,"bson_iter_init_find_case","key");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0xe8,"bson_iter_init_find_case","bson");
  abort();
}

Assistant:

bool
bson_iter_init_find_case (bson_iter_t *iter,  /* INOUT */
                          const bson_t *bson, /* IN */
                          const char *key)    /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   return bson_iter_init (iter, bson) && bson_iter_find_case (iter, key);
}